

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O3

int x25519_ge_frombytes_vartime(ge_p3 *h,uint8_t *s)

{
  fe *h_00;
  int iVar1;
  fe t1;
  fe_loose check;
  fe t2;
  fe vxx;
  fe u;
  fe w;
  fe_loose v;
  fe local_168;
  uint8_t *local_138;
  fe *local_130;
  fe local_128;
  fe local_f8;
  fe local_d0;
  fe local_a8;
  fe local_80;
  fe_loose local_58;
  
  h_00 = &h->Y;
  local_128.v[0] = *(uint64_t *)s;
  local_128.v[1] = *(uint64_t *)(s + 8);
  local_128.v[2] = *(uint64_t *)(s + 0x10);
  local_128.v[3] = *(ulong *)(s + 0x18) & 0x7fffffffffffffff;
  local_138 = s;
  fe_frombytes_strict(h_00,(uint8_t *)&local_128);
  (h->Z).v[3] = 0;
  (h->Z).v[4] = 0;
  (h->Z).v[1] = 0;
  (h->Z).v[2] = 0;
  (h->Z).v[0] = 1;
  local_130 = h_00;
  fe_sq_tt(&local_80,h_00);
  fe_mul_impl(local_d0.v,local_80.v,d.v);
  fe_sub(&local_58,&local_80,&h->Z);
  fe_carry(&local_a8,&local_58);
  fe_add(&local_58,&local_d0,&h->Z);
  fe_mul_impl(local_80.v,local_a8.v,local_58.v);
  fe_sq_tt(&local_128,&local_80);
  fe_sq_tt(&local_168,&local_128);
  fe_sq_tt(&local_168,&local_168);
  fe_mul_impl(local_168.v,local_80.v,local_168.v);
  fe_mul_impl(local_128.v,local_128.v,local_168.v);
  fe_sq_tt(&local_128,&local_128);
  fe_mul_impl(local_128.v,local_168.v,local_128.v);
  fe_sq_tt(&local_168,&local_128);
  iVar1 = 4;
  do {
    fe_sq_tt(&local_168,&local_168);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_128.v,local_168.v,local_128.v);
  fe_sq_tt(&local_168,&local_128);
  iVar1 = 9;
  do {
    fe_sq_tt(&local_168,&local_168);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_168.v,local_168.v,local_128.v);
  fe_sq_tt(&local_f8,&local_168);
  iVar1 = 0x13;
  do {
    fe_sq_tt(&local_f8,&local_f8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_168.v,local_f8.v,local_168.v);
  fe_sq_tt(&local_168,&local_168);
  iVar1 = 9;
  do {
    fe_sq_tt(&local_168,&local_168);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_128.v,local_168.v,local_128.v);
  fe_sq_tt(&local_168,&local_128);
  iVar1 = 0x31;
  do {
    fe_sq_tt(&local_168,&local_168);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_168.v,local_168.v,local_128.v);
  fe_sq_tt(&local_f8,&local_168);
  iVar1 = 99;
  do {
    fe_sq_tt(&local_f8,&local_f8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_168.v,local_f8.v,local_168.v);
  fe_sq_tt(&local_168,&local_168);
  iVar1 = 0x31;
  do {
    fe_sq_tt(&local_168,&local_168);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_128.v,local_168.v,local_128.v);
  fe_sq_tt(&local_128,&local_128);
  fe_sq_tt(&local_128,&local_128);
  fe_mul_impl((fe_limb_t *)h,local_128.v,local_80.v);
  fe_mul_impl((fe_limb_t *)h,(fe_limb_t *)h,local_a8.v);
  fe_sq_tt(&local_d0,&h->X);
  fe_mul_impl(local_d0.v,local_d0.v,local_58.v);
  fe_sub((fe_loose *)&local_128,&local_d0,&local_a8);
  iVar1 = fe_isnonzero((fe_loose *)&local_128);
  if (iVar1 != 0) {
    fe_add((fe_loose *)&local_128,&local_d0,&local_a8);
    iVar1 = fe_isnonzero((fe_loose *)&local_128);
    if (iVar1 != 0) {
      return 0;
    }
    fe_mul_impl((fe_limb_t *)h,(fe_limb_t *)h,sqrtm1.v);
  }
  fe_tobytes((uint8_t *)&local_168,&h->X);
  if (((byte)local_168.v[0] & 1) != local_138[0x1f] >> 7) {
    fe_neg((fe_loose *)&local_168,&h->X);
    fe_carry(&h->X,(fe_loose *)&local_168);
  }
  fe_mul_impl((h->T).v,(fe_limb_t *)h,local_130->v);
  return 1;
}

Assistant:

int x25519_ge_frombytes_vartime(ge_p3 *h, const uint8_t s[32]) {
  fe u;
  fe_loose v;
  fe w;
  fe vxx;
  fe_loose check;

  fe_frombytes(&h->Y, s);
  fe_1(&h->Z);
  fe_sq_tt(&w, &h->Y);
  fe_mul_ttt(&vxx, &w, &d);
  fe_sub(&v, &w, &h->Z);  // u = y^2-1
  fe_carry(&u, &v);
  fe_add(&v, &vxx, &h->Z);  // v = dy^2+1

  fe_mul_ttl(&w, &u, &v);        // w = u*v
  fe_pow22523(&h->X, &w);        // x = w^((q-5)/8)
  fe_mul_ttt(&h->X, &h->X, &u);  // x = u*w^((q-5)/8)

  fe_sq_tt(&vxx, &h->X);
  fe_mul_ttl(&vxx, &vxx, &v);
  fe_sub(&check, &vxx, &u);
  if (fe_isnonzero(&check)) {
    fe_add(&check, &vxx, &u);
    if (fe_isnonzero(&check)) {
      return 0;
    }
    fe_mul_ttt(&h->X, &h->X, &sqrtm1);
  }

  if (fe_isnegative(&h->X) != (s[31] >> 7)) {
    fe_loose t;
    fe_neg(&t, &h->X);
    fe_carry(&h->X, &t);
  }

  fe_mul_ttt(&h->T, &h->X, &h->Y);
  return 1;
}